

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitAwait(RegSlot resultReg,RegSlot inputReg,ByteCodeGenerator *byteCodeGenerator,
              FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  RegSlot instanceSlot;
  uint cacheId;
  ByteCodeLabel resumeNormalLabel;
  
  this = &byteCodeGenerator->m_writer;
  instanceSlot = funcInfo->awaitRegister;
  cacheId = FuncInfo::FindOrAddInlineCacheId(funcInfo,instanceSlot,0x197,false,true);
  Js::ByteCodeWriter::PatchableProperty(this,StFld,inputReg,instanceSlot,cacheId,false,true);
  resumeNormalLabel = Js::ByteCodeWriter::DefineLabel(this);
  EmitYieldAndResume(resultReg,funcInfo->awaitRegister,resumeNormalLabel,-1,byteCodeGenerator,
                     funcInfo);
  Js::ByteCodeWriter::Reg1(this,Throw,resultReg);
  Js::ByteCodeWriter::MarkLabel(this,resumeNormalLabel);
  return;
}

Assistant:

void EmitAwait(
    Js::RegSlot resultReg,
    Js::RegSlot inputReg,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{

    auto writer = byteCodeGenerator->Writer();
    writer->PatchableProperty(
        Js::OpCode::StFld,
        inputReg,
        funcInfo->awaitRegister,
        funcInfo->FindOrAddInlineCacheId(funcInfo->awaitRegister, Js::PropertyIds::value, false, true));
    Js::ByteCodeLabel resumeNormal = writer->DefineLabel();

    EmitYieldAndResume(
        resultReg,
        funcInfo->awaitRegister,
        resumeNormal,
        Js::Constants::NoByteCodeLabel,
        byteCodeGenerator,
        funcInfo);

    // Throw case: throw the resume value
    writer->Reg1(Js::OpCode::Throw, resultReg);

    // Normal case: continue (value is already in result register)
    writer->MarkLabel(resumeNormal);
}